

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,vm_val_t *filespec,vm_rcdesc *rc,int quiet,int script_more_mode)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined4 extraout_var;
  int in_EDX;
  char *in_RSI;
  CVmNetFile *in_RDI;
  err_frame_t err_cur__;
  CVmNetFile *nf;
  CVmNetFile *in_stack_fffffffffffffee0;
  void *pvVar5;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 uVar6;
  uint local_108 [2];
  undefined8 local_100;
  void *local_f8;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  vm_val_t *in_stack_ffffffffffffff60;
  CVmNetFile *in_stack_ffffffffffffff68;
  CVmConsole *in_stack_ffffffffffffff70;
  long local_28;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_28 = 0;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_100 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_108;
  local_108[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff10);
  if (local_108[0] == 0) {
    iVar1 = CVmNetFile::open(in_RSI,in_EDX,1,5,"text/plain");
    local_28 = CONCAT44(extraout_var,iVar1);
    CVmObjFile::check_safety_for_open(in_RDI,iVar2);
  }
  if ((local_108[0] == 1) && (local_108[0] = 2, local_28 != 0)) {
    CVmNetFile::abandon(in_stack_fffffffffffffee0);
    err_rethrow();
  }
  uVar6 = local_100;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar6;
  if ((local_108[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar5 = local_f8;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar5;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  iVar2 = open_script_file(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                           in_stack_ffffffffffffff58);
  return iVar2;
}

Assistant:

int CVmConsole::open_script_file(VMG_ const vm_val_t *filespec,
                                 const struct vm_rcdesc *rc,
                                 int quiet, int script_more_mode)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ filespec, rc, NETF_READ, OSFTCMD, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_READ);
    }